

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

Write<signed_char> __thiscall
Omega_h::deep_copy<signed_char>(Omega_h *this,Read<signed_char> *a,string *name)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO size_in;
  Write<signed_char> WVar2;
  ScopedTimer omega_h_scoped_function_timer;
  string name2;
  ScopedTimer local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Write<signed_char> local_98;
  Write<signed_char> local_88;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,&local_b9);
  std::operator+(&local_38,&local_58,":");
  std::__cxx11::to_string(&local_78,0x15a);
  std::operator+(&local_b8,&local_38,&local_78);
  begin_code("deep_copy",local_b8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (name->_M_string_length == 0) {
    Read<signed_char>::name_abi_cxx11_(&local_b8,a);
  }
  else {
    std::__cxx11::string::string((string *)&local_b8,(string *)name);
  }
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    size_in = (LO)pAVar1->size;
  }
  else {
    size_in = (LO)((ulong)pAVar1 >> 3);
  }
  Write<signed_char>::Write((Write<signed_char> *)this,size_in,&local_b8);
  Write<signed_char>::Write(&local_88,&a->write_);
  Write<signed_char>::Write(&local_98,(Write<signed_char> *)this);
  copy_into<signed_char>((Read<signed_char> *)&local_88,&local_98);
  Write<signed_char>::~Write(&local_98);
  Write<signed_char>::~Write(&local_88);
  std::__cxx11::string::~string((string *)&local_b8);
  ScopedTimer::~ScopedTimer(&local_ba);
  WVar2.shared_alloc_.direct_ptr = extraout_RDX;
  WVar2.shared_alloc_.alloc = (Alloc *)this;
  return (Write<signed_char>)WVar2.shared_alloc_;
}

Assistant:

Write<T> deep_copy(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  auto name2 = name.empty() ? a.name() : name;
  Write<T> b(a.size(), name2);
  copy_into(a, b);
  return b;
}